

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O3

void __thiscall QHostAddress::setAddress(QHostAddress *this,quint8 *ip6Addr)

{
  quint64 qVar1;
  QHostAddressPrivate *pQVar2;
  
  pQVar2 = (this->d).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1) {
    QExplicitlySharedDataPointer<QHostAddressPrivate>::detach_helper(&this->d);
    pQVar2 = (this->d).d.ptr;
  }
  pQVar2->protocol = '\x01';
  qVar1 = *(quint64 *)(ip6Addr + 8);
  (pQVar2->field_1).a6_64.c[0] = *(quint64 *)ip6Addr;
  (pQVar2->field_1).a6_64.c[1] = qVar1;
  pQVar2->a = 0;
  convertToIpv4(&pQVar2->a,&(pQVar2->field_1).a6,(ConversionMode)0x5);
  return;
}

Assistant:

void QHostAddress::setAddress(const quint8 *ip6Addr)
{
    d.detach();
    d->setAddress(ip6Addr);
}